

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O1

int __thiscall
ABlasterFX1::DoSpecialDamage(ABlasterFX1 *this,AActor *target,int damage,FName damagetype)

{
  int iVar1;
  uint uVar2;
  PClass *pPVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  bool bVar5;
  FName local_1c;
  
  local_1c.Index = FName::NameManager::FindName(&FName::NameData,"Ironlich",true);
  pPVar3 = PClass::FindClass(&local_1c);
  if ((target->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar1 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target);
    (target->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
  }
  pPVar4 = (target->super_DThinker).super_DObject.Class;
  bVar5 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar3 && bVar5) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar5 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar3) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (bVar5) {
    uVar2 = FRandom::GenRand32(&pr_bfx1);
    damage = -(uint)((uVar2 & 1) == 0) | 1;
  }
  return damage;
}

Assistant:

int ABlasterFX1::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	if (target->IsKindOf (PClass::FindClass ("Ironlich")))
	{ // Less damage to Ironlich bosses
		damage = pr_bfx1() & 1;
		if (!damage)
		{
			return -1;
		}
	}
	return damage;
}